

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall google::protobuf::Descriptor::CopyTo(Descriptor *this,DescriptorProto *proto)

{
  int iVar1;
  int iVar2;
  int iVar3;
  MessageOptions *this_00;
  MessageOptions *pMVar4;
  FieldDescriptorProto *in_RSI;
  Descriptor *in_RDI;
  int i_7;
  ReservedRange *range;
  int i_6;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  string *in_stack_ffffffffffffff18;
  DescriptorProto *in_stack_ffffffffffffff20;
  DescriptorProto_ExtensionRange *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  OneofDescriptorProto *in_stack_ffffffffffffff38;
  OneofDescriptor *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff88;
  OneofDescriptor *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  int iVar5;
  FieldDescriptorProto *this_01;
  
  this_01 = in_RSI;
  name_abi_cxx11_(in_RDI);
  DescriptorProto::set_name(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  iVar5 = 0;
  while( true ) {
    iVar3 = iVar5;
    iVar1 = field_count(in_RDI);
    if (iVar1 <= iVar5) break;
    field(in_RDI,iVar3);
    DescriptorProto::add_field((DescriptorProto *)0x494068);
    FieldDescriptor::CopyTo
              ((FieldDescriptor *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_RSI);
    iVar5 = iVar3 + 1;
  }
  iVar5 = 0;
  while( true ) {
    iVar1 = iVar5;
    iVar2 = oneof_decl_count(in_RDI);
    if (iVar2 <= iVar5) break;
    in_stack_ffffffffffffff90 = oneof_decl(in_RDI,iVar1);
    DescriptorProto::add_oneof_decl((DescriptorProto *)0x4940e4);
    OneofDescriptor::CopyTo(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    iVar5 = iVar1 + 1;
  }
  local_1c = 0;
  while( true ) {
    iVar5 = local_1c;
    iVar2 = nested_type_count(in_RDI);
    if (iVar2 <= iVar5) break;
    nested_type(in_RDI,local_1c);
    DescriptorProto::add_nested_type((DescriptorProto *)0x494157);
    CopyTo((Descriptor *)this_01,(DescriptorProto *)CONCAT44(iVar3,iVar1));
    local_1c = local_1c + 1;
  }
  local_20 = 0;
  while( true ) {
    iVar3 = enum_type_count(in_RDI);
    if (iVar3 <= local_20) break;
    enum_type(in_RDI,local_20);
    DescriptorProto::add_enum_type((DescriptorProto *)0x4941ca);
    EnumDescriptor::CopyTo
              ((EnumDescriptor *)in_stack_ffffffffffffff90,
               (EnumDescriptorProto *)CONCAT44(iVar5,in_stack_ffffffffffffff88));
    local_20 = local_20 + 1;
  }
  local_24 = 0;
  while( true ) {
    iVar5 = extension_range_count(in_RDI);
    if (iVar5 <= local_24) break;
    extension_range(in_RDI,local_24);
    DescriptorProto::add_extension_range((DescriptorProto *)0x49423d);
    ExtensionRange::CopyTo
              ((ExtensionRange *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               in_stack_ffffffffffffff28);
    local_24 = local_24 + 1;
  }
  local_28 = 0;
  while( true ) {
    iVar5 = extension_count(in_RDI);
    if (iVar5 <= local_28) break;
    extension(in_RDI,local_28);
    DescriptorProto::add_extension((DescriptorProto *)0x4942b0);
    FieldDescriptor::CopyTo
              ((FieldDescriptor *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_RSI);
    local_28 = local_28 + 1;
  }
  local_2c = 0;
  while( true ) {
    iVar5 = reserved_range_count(in_RDI);
    if (iVar5 <= local_2c) break;
    DescriptorProto::add_reserved_range((DescriptorProto *)0x49430e);
    reserved_range(in_RDI,local_2c);
    DescriptorProto_ReservedRange::set_start
              ((DescriptorProto_ReservedRange *)in_stack_ffffffffffffff20,
               (int32)((ulong)in_stack_ffffffffffffff18 >> 0x20));
    reserved_range(in_RDI,local_2c);
    DescriptorProto_ReservedRange::set_end
              ((DescriptorProto_ReservedRange *)in_stack_ffffffffffffff20,
               (int32)((ulong)in_stack_ffffffffffffff18 >> 0x20));
    local_2c = local_2c + 1;
  }
  iVar5 = 0;
  while( true ) {
    iVar3 = iVar5;
    iVar1 = reserved_name_count(in_RDI);
    if (iVar1 <= iVar5) break;
    reserved_name_abi_cxx11_(in_RDI,iVar3);
    DescriptorProto::add_reserved_name(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    iVar5 = iVar3 + 1;
  }
  this_00 = options(in_RDI);
  pMVar4 = MessageOptions::default_instance();
  if (this_00 != pMVar4) {
    pMVar4 = DescriptorProto::mutable_options((DescriptorProto *)0x494426);
    options(in_RDI);
    MessageOptions::CopyFrom(this_00,pMVar4);
  }
  return;
}

Assistant:

void Descriptor::CopyTo(DescriptorProto* proto) const {
  proto->set_name(name());

  for (int i = 0; i < field_count(); i++) {
    field(i)->CopyTo(proto->add_field());
  }
  for (int i = 0; i < oneof_decl_count(); i++) {
    oneof_decl(i)->CopyTo(proto->add_oneof_decl());
  }
  for (int i = 0; i < nested_type_count(); i++) {
    nested_type(i)->CopyTo(proto->add_nested_type());
  }
  for (int i = 0; i < enum_type_count(); i++) {
    enum_type(i)->CopyTo(proto->add_enum_type());
  }
  for (int i = 0; i < extension_range_count(); i++) {
    extension_range(i)->CopyTo(proto->add_extension_range());
  }
  for (int i = 0; i < extension_count(); i++) {
    extension(i)->CopyTo(proto->add_extension());
  }
  for (int i = 0; i < reserved_range_count(); i++) {
    DescriptorProto::ReservedRange* range = proto->add_reserved_range();
    range->set_start(reserved_range(i)->start);
    range->set_end(reserved_range(i)->end);
  }
  for (int i = 0; i < reserved_name_count(); i++) {
    proto->add_reserved_name(reserved_name(i));
  }

  if (&options() != &MessageOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }
}